

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O0

void __thiscall QAccessibleToolButton::actionNames(QAccessibleToolButton *this)

{
  QAccessibleToolButton *in_stack_00000008;
  
  actionNames(in_stack_00000008);
  return;
}

Assistant:

QStringList QAccessibleToolButton::actionNames() const
{
    QStringList names;
    if (widget()->isEnabled()) {
#if QT_CONFIG(menu)
        if (toolButton()->menu())
            names << showMenuAction();
        if (toolButton()->popupMode() != QToolButton::InstantPopup)
            names << QAccessibleButton::actionNames();
#endif
    }
    return names;
}